

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_sad_intrin_ssse3.c
# Opt level: O2

uint aom_masked_sad8xh_ssse3
               (uint8_t *src_ptr,int src_stride,uint8_t *a_ptr,int a_stride,uint8_t *b_ptr,
               int b_stride,uint8_t *m_ptr,int m_stride,int height)

{
  ulong uVar1;
  ulong uVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  short sVar7;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  undefined1 auVar8 [16];
  undefined1 auVar15 [16];
  short sVar24;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  short sVar25;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  undefined1 auVar26 [16];
  short sVar40;
  undefined1 auVar41 [16];
  char cVar50;
  char cVar51;
  char cVar52;
  char cVar53;
  char cVar54;
  char cVar55;
  char cVar56;
  char cVar57;
  char cVar58;
  char cVar59;
  char cVar60;
  char cVar61;
  char cVar62;
  char cVar63;
  undefined1 auVar49 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  
  iVar5 = 0;
  iVar6 = 0;
  for (iVar4 = 0; iVar4 < height; iVar4 = iVar4 + 2) {
    auVar17._8_8_ = *(undefined8 *)(src_ptr + src_stride);
    auVar17._0_8_ = *(undefined8 *)src_ptr;
    uVar1 = *(ulong *)a_ptr;
    uVar2 = *(ulong *)((long)a_ptr + (long)a_stride);
    uVar3 = *(undefined8 *)b_ptr;
    auVar14._8_6_ = 0;
    auVar14._0_8_ = uVar1;
    auVar14[0xe] = (char)(uVar1 >> 0x38);
    auVar14[0xf] = (char)((ulong)uVar3 >> 0x38);
    auVar13._14_2_ = auVar14._14_2_;
    auVar13._8_5_ = 0;
    auVar13._0_8_ = uVar1;
    auVar13[0xd] = (char)((ulong)uVar3 >> 0x30);
    auVar12._13_3_ = auVar13._13_3_;
    auVar12._8_4_ = 0;
    auVar12._0_8_ = uVar1;
    auVar12[0xc] = (char)(uVar1 >> 0x30);
    auVar11._12_4_ = auVar12._12_4_;
    auVar11._8_3_ = 0;
    auVar11._0_8_ = uVar1;
    auVar11[0xb] = (char)((ulong)uVar3 >> 0x28);
    auVar10._11_5_ = auVar11._11_5_;
    auVar10._8_2_ = 0;
    auVar10._0_8_ = uVar1;
    auVar10[10] = (char)(uVar1 >> 0x28);
    auVar9._10_6_ = auVar10._10_6_;
    auVar9[8] = 0;
    auVar9._0_8_ = uVar1;
    auVar9[9] = (char)((ulong)uVar3 >> 0x20);
    auVar8._9_7_ = auVar9._9_7_;
    auVar8[8] = (char)(uVar1 >> 0x20);
    auVar8._0_8_ = uVar1;
    auVar15._8_8_ = auVar8._8_8_;
    auVar15[7] = (char)((ulong)uVar3 >> 0x18);
    auVar15[6] = (char)(uVar1 >> 0x18);
    auVar15[5] = (char)((ulong)uVar3 >> 0x10);
    auVar15[4] = (char)(uVar1 >> 0x10);
    auVar15[3] = (char)((ulong)uVar3 >> 8);
    auVar15[2] = (char)(uVar1 >> 8);
    auVar15[0] = (undefined1)uVar1;
    auVar15[1] = (char)uVar3;
    uVar3 = *(undefined8 *)(b_ptr + b_stride);
    auVar33._8_6_ = 0;
    auVar33._0_8_ = uVar2;
    auVar33[0xe] = (char)(uVar2 >> 0x38);
    auVar33[0xf] = (char)((ulong)uVar3 >> 0x38);
    auVar32._14_2_ = auVar33._14_2_;
    auVar32._8_5_ = 0;
    auVar32._0_8_ = uVar2;
    auVar32[0xd] = (char)((ulong)uVar3 >> 0x30);
    auVar31._13_3_ = auVar32._13_3_;
    auVar31._8_4_ = 0;
    auVar31._0_8_ = uVar2;
    auVar31[0xc] = (char)(uVar2 >> 0x30);
    auVar30._12_4_ = auVar31._12_4_;
    auVar30._8_3_ = 0;
    auVar30._0_8_ = uVar2;
    auVar30[0xb] = (char)((ulong)uVar3 >> 0x28);
    auVar29._11_5_ = auVar30._11_5_;
    auVar29._8_2_ = 0;
    auVar29._0_8_ = uVar2;
    auVar29[10] = (char)(uVar2 >> 0x28);
    auVar28._10_6_ = auVar29._10_6_;
    auVar28[8] = 0;
    auVar28._0_8_ = uVar2;
    auVar28[9] = (char)((ulong)uVar3 >> 0x20);
    auVar27._9_7_ = auVar28._9_7_;
    auVar27[8] = (char)(uVar2 >> 0x20);
    auVar27._0_8_ = uVar2;
    auVar26._8_8_ = auVar27._8_8_;
    auVar26[7] = (char)((ulong)uVar3 >> 0x18);
    auVar26[6] = (char)(uVar2 >> 0x18);
    auVar26[5] = (char)((ulong)uVar3 >> 0x10);
    auVar26[4] = (char)(uVar2 >> 0x10);
    auVar26[3] = (char)((ulong)uVar3 >> 8);
    auVar26[2] = (char)(uVar2 >> 8);
    auVar26[0] = (undefined1)uVar2;
    auVar26[1] = (char)uVar3;
    uVar3 = *(undefined8 *)((long)m_ptr + (long)m_stride);
    uVar1 = *(ulong *)m_ptr;
    cVar50 = (char)(uVar1 >> 8);
    cVar51 = (char)(uVar1 >> 0x10);
    cVar52 = (char)(uVar1 >> 0x18);
    cVar53 = (char)(uVar1 >> 0x20);
    cVar54 = (char)(uVar1 >> 0x28);
    cVar55 = (char)(uVar1 >> 0x30);
    cVar56 = (char)(uVar1 >> 0x38);
    cVar57 = (char)((ulong)uVar3 >> 8);
    cVar58 = (char)((ulong)uVar3 >> 0x10);
    cVar59 = (char)((ulong)uVar3 >> 0x18);
    cVar60 = (char)((ulong)uVar3 >> 0x20);
    cVar61 = (char)((ulong)uVar3 >> 0x28);
    cVar62 = (char)((ulong)uVar3 >> 0x30);
    cVar63 = (char)((ulong)uVar3 >> 0x38);
    auVar48._8_6_ = 0;
    auVar48._0_8_ = uVar1;
    auVar48[0xe] = cVar56;
    auVar48[0xf] = '@' - cVar56;
    auVar47._14_2_ = auVar48._14_2_;
    auVar47._8_5_ = 0;
    auVar47._0_8_ = uVar1;
    auVar47[0xd] = '@' - cVar55;
    auVar46._13_3_ = auVar47._13_3_;
    auVar46._8_4_ = 0;
    auVar46._0_8_ = uVar1;
    auVar46[0xc] = cVar55;
    auVar45._12_4_ = auVar46._12_4_;
    auVar45._8_3_ = 0;
    auVar45._0_8_ = uVar1;
    auVar45[0xb] = '@' - cVar54;
    auVar44._11_5_ = auVar45._11_5_;
    auVar44._8_2_ = 0;
    auVar44._0_8_ = uVar1;
    auVar44[10] = cVar54;
    auVar43._10_6_ = auVar44._10_6_;
    auVar43[8] = 0;
    auVar43._0_8_ = uVar1;
    auVar43[9] = '@' - cVar53;
    auVar42._9_7_ = auVar43._9_7_;
    auVar42[8] = cVar53;
    auVar42._0_8_ = uVar1;
    auVar41._8_8_ = auVar42._8_8_;
    auVar41[7] = '@' - cVar52;
    auVar41[6] = cVar52;
    auVar41[5] = '@' - cVar51;
    auVar41[4] = cVar51;
    auVar41[3] = '@' - cVar50;
    auVar41[2] = cVar50;
    auVar41[1] = '@' - (char)uVar1;
    auVar41[0] = (char)uVar1;
    auVar15 = pmaddubsw(auVar15,auVar41);
    sVar7 = pavgw(auVar15._0_2_ >> 5,0);
    sVar18 = pavgw(auVar15._2_2_ >> 5,0);
    sVar19 = pavgw(auVar15._4_2_ >> 5,0);
    sVar20 = pavgw(auVar15._6_2_ >> 5,0);
    sVar21 = pavgw(auVar15._8_2_ >> 5,0);
    sVar22 = pavgw(auVar15._10_2_ >> 5,0);
    sVar23 = pavgw(auVar15._12_2_ >> 5,0);
    sVar24 = pavgw(auVar15._14_2_ >> 5,0);
    auVar49[1] = '@' - (char)uVar3;
    auVar49[0] = (char)uVar3;
    auVar49[2] = cVar57;
    auVar49[3] = '@' - cVar57;
    auVar49[4] = cVar58;
    auVar49[5] = '@' - cVar58;
    auVar49[6] = cVar59;
    auVar49[7] = '@' - cVar59;
    auVar49[8] = cVar60;
    auVar49[9] = '@' - cVar60;
    auVar49[10] = cVar61;
    auVar49[0xb] = '@' - cVar61;
    auVar49[0xc] = cVar62;
    auVar49[0xd] = '@' - cVar62;
    auVar49[0xe] = cVar63;
    auVar49[0xf] = '@' - cVar63;
    auVar15 = pmaddubsw(auVar26,auVar49);
    sVar25 = pavgw(auVar15._0_2_ >> 5,0);
    sVar34 = pavgw(auVar15._2_2_ >> 5,0);
    sVar35 = pavgw(auVar15._4_2_ >> 5,0);
    sVar36 = pavgw(auVar15._6_2_ >> 5,0);
    sVar37 = pavgw(auVar15._8_2_ >> 5,0);
    sVar38 = pavgw(auVar15._10_2_ >> 5,0);
    sVar39 = pavgw(auVar15._12_2_ >> 5,0);
    sVar40 = pavgw(auVar15._14_2_ >> 5,0);
    auVar16[1] = (0 < sVar18) * (sVar18 < 0x100) * (char)sVar18 - (0xff < sVar18);
    auVar16[0] = (0 < sVar7) * (sVar7 < 0x100) * (char)sVar7 - (0xff < sVar7);
    auVar16[2] = (0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 - (0xff < sVar19);
    auVar16[3] = (0 < sVar20) * (sVar20 < 0x100) * (char)sVar20 - (0xff < sVar20);
    auVar16[4] = (0 < sVar21) * (sVar21 < 0x100) * (char)sVar21 - (0xff < sVar21);
    auVar16[5] = (0 < sVar22) * (sVar22 < 0x100) * (char)sVar22 - (0xff < sVar22);
    auVar16[6] = (0 < sVar23) * (sVar23 < 0x100) * (char)sVar23 - (0xff < sVar23);
    auVar16[7] = (0 < sVar24) * (sVar24 < 0x100) * (char)sVar24 - (0xff < sVar24);
    auVar16[8] = (0 < sVar25) * (sVar25 < 0x100) * (char)sVar25 - (0xff < sVar25);
    auVar16[9] = (0 < sVar34) * (sVar34 < 0x100) * (char)sVar34 - (0xff < sVar34);
    auVar16[10] = (0 < sVar35) * (sVar35 < 0x100) * (char)sVar35 - (0xff < sVar35);
    auVar16[0xb] = (0 < sVar36) * (sVar36 < 0x100) * (char)sVar36 - (0xff < sVar36);
    auVar16[0xc] = (0 < sVar37) * (sVar37 < 0x100) * (char)sVar37 - (0xff < sVar37);
    auVar16[0xd] = (0 < sVar38) * (sVar38 < 0x100) * (char)sVar38 - (0xff < sVar38);
    auVar16[0xe] = (0 < sVar39) * (sVar39 < 0x100) * (char)sVar39 - (0xff < sVar39);
    auVar16[0xf] = (0 < sVar40) * (sVar40 < 0x100) * (char)sVar40 - (0xff < sVar40);
    auVar17 = psadbw(auVar16,auVar17);
    iVar5 = iVar5 + auVar17._0_4_;
    iVar6 = iVar6 + auVar17._8_4_;
    src_ptr = src_ptr + src_stride * 2;
    a_ptr = (uint8_t *)((long)a_ptr + (long)(a_stride * 2));
    b_ptr = b_ptr + b_stride * 2;
    m_ptr = (uint8_t *)((long)m_ptr + (long)(m_stride * 2));
  }
  return iVar6 + iVar5;
}

Assistant:

unsigned int aom_masked_sad8xh_ssse3(const uint8_t *src_ptr, int src_stride,
                                     const uint8_t *a_ptr, int a_stride,
                                     const uint8_t *b_ptr, int b_stride,
                                     const uint8_t *m_ptr, int m_stride,
                                     int height) {
  int y;
  __m128i res = _mm_setzero_si128();
  const __m128i mask_max = _mm_set1_epi8((1 << AOM_BLEND_A64_ROUND_BITS));

  for (y = 0; y < height; y += 2) {
    const __m128i src = _mm_unpacklo_epi64(
        _mm_loadl_epi64((const __m128i *)src_ptr),
        _mm_loadl_epi64((const __m128i *)&src_ptr[src_stride]));
    const __m128i a0 = _mm_loadl_epi64((const __m128i *)a_ptr);
    const __m128i a1 = _mm_loadl_epi64((const __m128i *)&a_ptr[a_stride]);
    const __m128i b0 = _mm_loadl_epi64((const __m128i *)b_ptr);
    const __m128i b1 = _mm_loadl_epi64((const __m128i *)&b_ptr[b_stride]);
    const __m128i m =
        _mm_unpacklo_epi64(_mm_loadl_epi64((const __m128i *)m_ptr),
                           _mm_loadl_epi64((const __m128i *)&m_ptr[m_stride]));
    const __m128i m_inv = _mm_sub_epi8(mask_max, m);

    const __m128i data_l = _mm_unpacklo_epi8(a0, b0);
    const __m128i mask_l = _mm_unpacklo_epi8(m, m_inv);
    __m128i pred_l = _mm_maddubs_epi16(data_l, mask_l);
    pred_l = xx_roundn_epu16(pred_l, AOM_BLEND_A64_ROUND_BITS);

    const __m128i data_r = _mm_unpacklo_epi8(a1, b1);
    const __m128i mask_r = _mm_unpackhi_epi8(m, m_inv);
    __m128i pred_r = _mm_maddubs_epi16(data_r, mask_r);
    pred_r = xx_roundn_epu16(pred_r, AOM_BLEND_A64_ROUND_BITS);

    const __m128i pred = _mm_packus_epi16(pred_l, pred_r);
    res = _mm_add_epi32(res, _mm_sad_epu8(pred, src));

    src_ptr += src_stride * 2;
    a_ptr += a_stride * 2;
    b_ptr += b_stride * 2;
    m_ptr += m_stride * 2;
  }
  unsigned int sad = (unsigned int)(_mm_cvtsi128_si32(res) +
                                    _mm_cvtsi128_si32(_mm_srli_si128(res, 8)));
  return sad;
}